

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  BYTE *iend;
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  ldmState_t *ldmState;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  undefined4 extraout_var;
  size_t extraout_RAX_01;
  size_t extraout_RAX_02;
  size_t extraout_RAX_03;
  byte bVar17;
  ulong srcSize_00;
  int iVar18;
  U32 UVar19;
  long lVar20;
  BYTE *ip;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff84;
  ZSTD_strategy ZVar25;
  undefined4 uStack_74;
  undefined4 uStack_48;
  
  bVar22 = (params->ldmParams).enableLdm == ZSTD_ps_enable;
  ZVar25 = (ZSTD_strategy)ls;
  uStack_74 = (undefined4)((ulong)ls >> 0x20);
  bVar23 = ls != (ldmState_t *)0x0;
  uVar3 = (params->cParams).hashLog;
  uVar4 = (params->cParams).searchLog;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  uVar7 = (params->cParams).strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  uVar8 = (ms->cParams).windowLog;
  uVar9 = (ms->cParams).hashLog;
  uVar10 = (ms->cParams).searchLog;
  cParams2.chainLog = uVar10;
  cParams2.windowLog = uVar9;
  uVar11 = (ms->cParams).minMatch;
  uVar12 = (ms->cParams).targetLength;
  uVar13 = (ms->cParams).strategy;
  cParams2.minMatch = uVar13;
  cParams2.searchLog = uVar12;
  cParams1.hashLog = uVar5;
  cParams1.targetLength = in_stack_ffffffffffffff64;
  cParams1.strategy = uVar8;
  cParams2.hashLog = uVar11;
  cParams2.targetLength = in_stack_ffffffffffffff84;
  cParams2.strategy = ZVar25;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  bVar21 = 0xfffffffd < (params->cParams).strategy - ZSTD_greedy;
  bVar24 = tfp == ZSTD_tfp_forCDict;
  if ((bVar24 && bVar21) && (bVar23 && bVar22)) {
    __assert_fail("!loadLdmDict",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1269,
                  "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                 );
  }
  iend = (BYTE *)(srcSize + (long)src);
  lVar20 = -0xfffffe;
  if (!bVar24 || !bVar21) {
    lVar20 = -0xdffffffe;
  }
  srcSize_00 = 0xfffffe;
  if (!bVar24 || !bVar21) {
    srcSize_00 = 0xdffffffe;
  }
  ip = iend + lVar20;
  if (srcSize <= srcSize_00) {
    ip = (BYTE *)src;
    srcSize_00 = srcSize;
  }
  iVar18 = (int)iend;
  if (0x1fffffff < srcSize_00) {
    if ((((ms->window).dictLimit != 2) || ((ms->window).lowLimit != 2)) ||
       ((long)(ms->window).nextSrc - (long)(ms->window).base != 2)) {
      __assert_fail("ZSTD_window_isEmpty(ms->window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1276,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    if (!bVar23 || !bVar22) {
      ZSTD_window_update(&ms->window,ip,srcSize_00,0);
      goto LAB_005ad7e3;
    }
    if (((*(int *)(CONCAT44(uStack_74,ZVar25) + 0x18) != 2) ||
        (*(int *)(CONCAT44(uStack_74,ZVar25) + 0x1c) != 2)) ||
       (*(long *)CONCAT44(uStack_74,ZVar25) - ((long *)CONCAT44(uStack_74,ZVar25))[1] != 2)) {
      __assert_fail("ZSTD_window_isEmpty(ls->window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1277,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
  }
  UVar19 = 0;
  ZSTD_window_update(&ms->window,ip,srcSize_00,0);
  if (bVar23 && bVar22) {
    ldmState = (ldmState_t *)CONCAT44(uStack_74,ZVar25);
    ZSTD_window_update((ZSTD_window_t *)ldmState,ip,srcSize_00,0);
    if (params->forceWindow == 0) {
      UVar19 = iVar18 - *(int *)&(ldmState->window).base;
    }
    ldmState->loadedDictEnd = UVar19;
    ZSTD_ldm_fillHashTable(ldmState,ip,iend,&params->ldmParams);
  }
LAB_005ad7e3:
  if ((params->cParams).strategy < ZSTD_btultra) {
    uVar14 = (params->cParams).chainLog;
    uVar1 = (params->cParams).hashLog;
    if (uVar14 < uVar1) {
      uVar14 = uVar1;
    }
    bVar17 = 0x1c;
    if (uVar14 < 0x1c) {
      bVar17 = (byte)uVar14;
    }
    uVar15 = (ulong)(uint)(8 << (bVar17 & 0x1f));
    if (uVar15 < srcSize_00) {
      ip = iend + -uVar15;
    }
    if (uVar15 <= srcSize_00) {
      srcSize_00 = uVar15;
    }
  }
  iVar2 = *(int *)&(ms->window).base;
  ms->nextToUpdate = (int)ip - iVar2;
  UVar19 = 0;
  if (params->forceWindow == 0) {
    UVar19 = iVar18 - iVar2;
  }
  ms->loadedDictEnd = UVar19;
  sVar16 = (size_t)(uint)params->deterministicRefPrefix;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (8 < srcSize_00) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip,iend);
    switch((params->cParams).strategy) {
    case ZSTD_fast:
      ZSTD_fillHashTable(ms,iend,dtlm,tfp);
      sVar16 = extraout_RAX_01;
      break;
    case ZSTD_dfast:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm,tfp);
      sVar16 = extraout_RAX_02;
      break;
    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_ps_enable) {
          memset(ms->tagTable,0,1L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend + -8);
          sVar16 = extraout_RAX_03;
        }
        else {
          if (params->useRowMatchFinder == ZSTD_ps_auto) {
            __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x12a6,
                          "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                         );
          }
          UVar19 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
          sVar16 = CONCAT44(extraout_var,UVar19);
        }
      }
      else {
        if (ms->chainTable == (U32 *)0x0) {
          __assert_fail("ms->chainTable != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x12a3,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
        sVar16 = extraout_RAX_00;
      }
      break;
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
      ZSTD_updateTree(ms,iend + -8,iend);
      sVar16 = extraout_RAX;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x12bc,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    ms->nextToUpdate = iVar18 - *(int *)&(ms->window).base;
  }
  return sVar16;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            /* src = ip; deadcode.DeadStores */
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}